

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapshot.h
# Opt level: O0

void TTD::SnapShot::
     EmitListHelper<void(*)(TTD::NSSnapValues::ScriptFunctionScopeInfo_const*,TTD::FileWriter*,TTD::NSTokens::Separator),TTD::NSSnapValues::ScriptFunctionScopeInfo,2048ul>
               (_func_void_ScriptFunctionScopeInfo_ptr_FileWriter_ptr_Separator *emitFunc,
               UnorderedArrayList<TTD::NSSnapValues::ScriptFunctionScopeInfo,_2048UL> *list,
               FileWriter *snapwriter)

{
  bool bVar1;
  uint32 length;
  ScriptFunctionScopeInfo *pSVar2;
  Separator local_59;
  undefined1 local_50 [8];
  Iterator iter;
  bool firstElement;
  FileWriter *snapwriter_local;
  UnorderedArrayList<TTD::NSSnapValues::ScriptFunctionScopeInfo,_2048UL> *list_local;
  _func_void_ScriptFunctionScopeInfo_ptr_FileWriter_ptr_Separator *emitFunc_local;
  
  length = UnorderedArrayList<TTD::NSSnapValues::ScriptFunctionScopeInfo,_2048UL>::Count(list);
  FileWriter::WriteLengthValue(snapwriter,length,CommaAndBigSpaceSeparator);
  FileWriter::WriteSequenceStart_DefaultKey(snapwriter,CommaAndBigSpaceSeparator);
  (*snapwriter->_vptr_FileWriter[8])(snapwriter,1);
  iter.m_currEntry._7_1_ = 1;
  UnorderedArrayList<TTD::NSSnapValues::ScriptFunctionScopeInfo,_2048UL>::GetIterator
            ((Iterator *)local_50,list);
  while( true ) {
    bVar1 = UnorderedArrayList<TTD::NSSnapValues::ScriptFunctionScopeInfo,_2048UL>::Iterator::
            IsValid((Iterator *)local_50);
    if (!bVar1) break;
    pSVar2 = UnorderedArrayList<TTD::NSSnapValues::ScriptFunctionScopeInfo,_2048UL>::Iterator::
             Current((Iterator *)local_50);
    local_59 = BigSpaceSeparator;
    if ((iter.m_currEntry._7_1_ & 1) == 0) {
      local_59 = CommaAndBigSpaceSeparator;
    }
    (*emitFunc)(pSVar2,snapwriter,local_59);
    iter.m_currEntry._7_1_ = 0;
    UnorderedArrayList<TTD::NSSnapValues::ScriptFunctionScopeInfo,_2048UL>::Iterator::MoveNext
              ((Iterator *)local_50);
  }
  (*snapwriter->_vptr_FileWriter[8])(snapwriter,0xffffffff);
  (*snapwriter->_vptr_FileWriter[5])(snapwriter,2);
  return;
}

Assistant:

static void EmitListHelper(Fn emitFunc, const UnorderedArrayList<T, allocSize>& list, FileWriter* snapwriter)
        {
            snapwriter->WriteLengthValue(list.Count(), NSTokens::Separator::CommaAndBigSpaceSeparator);
            snapwriter->WriteSequenceStart_DefaultKey(NSTokens::Separator::CommaAndBigSpaceSeparator);
            snapwriter->AdjustIndent(1);
            bool firstElement = true;
            for(auto iter = list.GetIterator(); iter.IsValid(); iter.MoveNext())
            {
                (*emitFunc)(iter.Current(), snapwriter, firstElement ? NSTokens::Separator::BigSpaceSeparator : NSTokens::Separator::CommaAndBigSpaceSeparator);
                firstElement = false;
            }
            snapwriter->AdjustIndent(-1);
            snapwriter->WriteSequenceEnd(NSTokens::Separator::BigSpaceSeparator);
        }